

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O2

void gen_mtfsb0(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 pTVar1;
  uint uVar2;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  if (ctx->fpu_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    uVar2 = ctx->opcode >> 0x15 & 0x1f;
    gen_reset_fpstatus(tcg_ctx);
    if (uVar2 - 3 < 0xfffffffe) {
      pTVar1 = tcg_const_i32_ppc64(tcg_ctx,uVar2 ^ 0x1f);
      local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_20 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
      tcg_gen_callN_ppc64(tcg_ctx,helper_fpscr_clrbit,(TCGTemp *)0x0,2,&local_28);
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    }
    if ((ctx->opcode & 1) != 0) {
      tcg_gen_extrl_i64_i32_ppc64(tcg_ctx,cpu_crf[1],cpu_fpscr);
      tcg_gen_shri_i32_ppc64(tcg_ctx,cpu_crf[1],cpu_crf[1],0x1c);
    }
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_mtfsb0(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint8_t crb;

    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    crb = 31 - crbD(ctx->opcode);
    gen_reset_fpstatus(tcg_ctx);
    if (likely(crb != FPSCR_FEX && crb != FPSCR_VX)) {
        TCGv_i32 t0;
        t0 = tcg_const_i32(tcg_ctx, crb);
        gen_helper_fpscr_clrbit(tcg_ctx, tcg_ctx->cpu_env, t0);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        tcg_gen_trunc_tl_i32(tcg_ctx, cpu_crf[1], cpu_fpscr);
        tcg_gen_shri_i32(tcg_ctx, cpu_crf[1], cpu_crf[1], FPSCR_OX);
    }
}